

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::InterfaceMatchingCaseFloat::generateVarLinkVertexShaderSrc
          (InterfaceMatchingCaseFloat *this,string *outVtxSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  ostream *poVar4;
  long lVar5;
  ostringstream vtxSrc;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (8 < (int)glslVersion) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n",0x2a);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in highp vec4 a_position;\n",0x1a);
  poVar4 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"uniform highp vec4 u_color;\n",0x1c);
  lVar5 = 0xf;
  pcVar1 = "out float var;\n";
  if (testMode != DEFAULT_PRECISION) {
    if (testMode == SET_PRECISION) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(precision->_M_dataplus)._M_p,
                          precision->_M_string_length);
      lVar5 = 0xc;
      pcVar1 = " float var;\n";
    }
    else {
      if (testMode != SET_DEFAULT_PRECISION) goto LAB_00bf5884;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"precision ",10);
      poVar4 = (ostream *)local_1a8;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(precision->_M_dataplus)._M_p,precision->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," float;\n",8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar1,lVar5);
LAB_00bf5884:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"   gl_Position = a_position;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"   var = u_color.r;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)outVtxSrc,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, const string& precision,
										TestType testMode)
	{
		std::ostringstream vtxSrc;
		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			vtxSrc << "precision " << precision << " float;\n";
		case DEFAULT_PRECISION:
			vtxSrc << "out float var;\n";
			break;
		case SET_PRECISION:
			vtxSrc << "out " << precision << " float var;\n";
			break;
		}
		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";
		vtxSrc << "   var = u_color.r;\n";
		vtxSrc << "}\n";
		outVtxSrc = vtxSrc.str();
	}